

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.pb.h
# Opt level: O0

TestAllTypes * __thiscall
proto2_unittest::NestedTestAllTypes::_internal_mutable_eager_child(NestedTestAllTypes *this)

{
  Arena *arena;
  TestAllTypes *pTVar1;
  TestAllTypes *p;
  NestedTestAllTypes *this_local;
  
  if ((this->field_0)._impl_.eager_child_ == (TestAllTypes *)0x0) {
    arena = google::protobuf::MessageLite::GetArena((MessageLite *)this);
    pTVar1 = (TestAllTypes *)
             google::protobuf::Arena::DefaultConstruct<proto2_unittest::TestAllTypes>(arena);
    (this->field_0)._impl_.eager_child_ = pTVar1;
  }
  return (this->field_0)._impl_.eager_child_;
}

Assistant:

NestedTestAllTypes::_internal_mutable_eager_child() {
  ::google::protobuf::internal::TSanWrite(&_impl_);
  if (_impl_.eager_child_ == nullptr) {
    auto* p = ::google::protobuf::Message::DefaultConstruct<::proto2_unittest::TestAllTypes>(GetArena());
    _impl_.eager_child_ = reinterpret_cast<::proto2_unittest::TestAllTypes*>(p);
  }
  return _impl_.eager_child_;
}